

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawFuzzColumnPalCommand::Execute(DrawFuzzColumnPalCommand *this,DrawerThread *thread)

{
  bool bVar1;
  BYTE *pBVar2;
  int *piVar3;
  int core_skip;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int pass_skip;
  uint uVar8;
  BYTE *pBVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  
  pBVar2 = NormalLight.Maps;
  uVar8 = *(uint *)&(this->super_DrawerCommand).field_0xc;
  uVar14 = 1;
  if (1 < (int)uVar8) {
    uVar14 = uVar8;
  }
  iVar11 = this->_fuzzviewheight;
  iVar12 = this->_yh;
  if (iVar11 <= this->_yh) {
    iVar12 = iVar11;
  }
  iVar4 = (iVar12 - uVar14) + 1;
  iVar12 = thread->pass_end_y - uVar14;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (iVar4 < iVar12) {
    iVar12 = iVar4;
  }
  uVar8 = thread->pass_start_y - uVar14;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  iVar4 = thread->num_cores;
  lVar10 = (long)iVar4;
  iVar6 = (iVar4 - (int)((uVar8 + uVar14) - thread->core) % iVar4) % iVar4;
  iVar12 = (int)((~uVar8 + iVar4 + iVar12) - iVar6) / iVar4;
  if (0 < iVar12) {
    iVar6 = iVar6 + uVar8;
    pBVar9 = this->_destorg +
             (long)(this->_pitch * iVar6) + (long)this->_x + (long)(int)(&ylookup)[uVar14];
    iVar13 = (this->_fuzzpos + iVar6) % 0x32;
    lVar15 = (long)(this->_pitch * iVar4);
    if ((int)(iVar6 + uVar14) < iVar4) {
      *pBVar9 = NormalLight.Maps
                [(ulong)pBVar9[lVar15 + (int)(&fuzzoffset)[iVar13] * lVar10] + 0x600];
      iVar12 = iVar12 + -1;
      if (iVar12 == 0) {
        return;
      }
      iVar13 = (iVar13 + iVar4) % 0x32;
      pBVar9 = pBVar9 + lVar15;
      iVar11 = this->_fuzzviewheight;
    }
    iVar6 = (iVar4 + iVar12 + -1) * iVar4 + iVar6 + uVar14;
    iVar12 = iVar12 - (uint)(iVar11 < iVar6);
    if (0 < iVar12) {
      do {
        iVar5 = ((0x32 - iVar13) / iVar4 + 1) - (uint)((0x32 - iVar13) % iVar4 == 0);
        if (iVar12 < iVar5) {
          iVar5 = iVar12;
        }
        piVar3 = &fuzzoffset + iVar13;
        iVar7 = iVar5;
        do {
          *pBVar9 = pBVar2[(ulong)pBVar9[*piVar3 * lVar10] + 0x600];
          pBVar9 = pBVar9 + lVar15;
          piVar3 = piVar3 + lVar10;
          iVar13 = iVar13 + iVar4;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        iVar13 = iVar13 % 0x32;
        iVar7 = iVar12 - iVar5;
        bVar1 = iVar5 <= iVar12;
        iVar12 = iVar7;
      } while (iVar7 != 0 && bVar1);
    }
    if (iVar11 < iVar6) {
      *pBVar9 = pBVar2[(ulong)pBVar9[(int)(&fuzzoffset)[iVar13] * lVar10 - lVar15] + 0x600];
    }
  }
  return;
}

Assistant:

void DrawFuzzColumnPalCommand::Execute(DrawerThread *thread)
	{
		int yl = MAX(_yl, 1);
		int yh = MIN(_yh, _fuzzviewheight);

		int count = thread->count_for_thread(yl, yh - yl + 1);

		// Zero length.
		if (count <= 0)
			return;

		uint8_t *map = &NormalLight.Maps[6 * 256];

		uint8_t *dest = thread->dest_for_thread(yl, _pitch, ylookup[yl] + _x + _destorg);

		int pitch = _pitch * thread->num_cores;
		int fuzzstep = thread->num_cores;
		int fuzz = (_fuzzpos + thread->skipped_by_thread(yl)) % FUZZTABLE;

		yl += thread->skipped_by_thread(yl);

		// Handle the case where we would go out of bounds at the top:
		if (yl < fuzzstep)
		{
			uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep + pitch;
			//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

			*dest = map[*srcdest];
			dest += pitch;
			fuzz += fuzzstep;
			fuzz %= FUZZTABLE;

			count--;
			if (count == 0)
				return;
		}

		bool lowerbounds = (yl + (count + fuzzstep - 1) * fuzzstep > _fuzzviewheight);
		if (lowerbounds)
			count--;

		// Fuzz where fuzzoffset stays within bounds
		while (count > 0)
		{
			int available = (FUZZTABLE - fuzz);
			int next_wrap = available / fuzzstep;
			if (available % fuzzstep != 0)
				next_wrap++;

			int cnt = MIN(count, next_wrap);
			count -= cnt;
			do
			{
				uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep;
				//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

				*dest = map[*srcdest];
				dest += pitch;
				fuzz += fuzzstep;
			} while (--cnt);

			fuzz %= FUZZTABLE;
		}

		// Handle the case where we would go out of bounds at the bottom
		if (lowerbounds)
		{
			uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep - pitch;
			//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

			*dest = map[*srcdest];
		}
	}